

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# squall_defun.hpp
# Opt level: O2

SQInteger squall::detail::stub<1,std::function<int(Foo_const*)>>(HSQUIRRELVM vm)

{
  int iVar1;
  SQRESULT SVar2;
  SQUserPointer fp;
  function<int_(const_Foo_*)> local_38;
  
  SVar2 = sq_getuserdata(vm,-1,&fp,(SQUserPointer *)0x0);
  if (-1 < SVar2) {
    std::function<int_(const_Foo_*)>::function(&local_38,*fp);
    iVar1 = Stub<int(Foo_const*)>::doit<std::function<int(Foo_const*)>>(vm,1,&local_38);
    std::_Function_base::~_Function_base(&local_38.super__Function_base);
    return (long)iVar1;
  }
  __assert_fail("0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/KatuH[P]squall/samples/../squall/squall_defun.hpp"
                ,0x42,
                "SQInteger squall::detail::stub(HSQUIRRELVM) [Offset = 1, F = std::function<int (const Foo *)>]"
               );
}

Assistant:

SQInteger stub(HSQUIRRELVM vm) {
    try {
        SQUserPointer fp;
        if(!SQ_SUCCEEDED(sq_getuserdata(vm, -1, &fp, NULL))) { assert(0); }
        const F& f = **((F**)fp);

        SQInteger x = Stub<typename detail::function_traits<F>::type>::doit(
            vm, Offset, f);
        return x;
    }
    catch(std::exception& e) {
        return sq_throwerror(
            vm, (string(_SC("error in callback: ")) + locale_converter::to_squall_string(e.what()).c_str()).c_str());
    }
}